

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<13>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint *ptr;
  RepeatedField<unsigned_int> *array;
  int i;
  int index;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32 *)((long)field + 0x10),output);
    for (index = 0; index < *field; index = index + 1) {
      ptr = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(ptr,output);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}